

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterJoinThread(SortSubtask *pTask)

{
  SQLiteThread *in_RDI;
  bool bVar1;
  void *pRet;
  int rc;
  uint in_stack_fffffffffffffff0;
  
  bVar1 = in_RDI->tid != 0;
  if (bVar1) {
    sqlite3ThreadJoin(in_RDI,(void **)(ulong)in_stack_fffffffffffffff0);
    in_RDI->done = 0;
    in_RDI->tid = 0;
  }
  return (uint)bVar1;
}

Assistant:

static int vdbeSorterJoinThread(SortSubtask *pTask){
  int rc = SQLITE_OK;
  if( pTask->pThread ){
#ifdef SQLITE_DEBUG_SORTER_THREADS
    int bDone = pTask->bDone;
#endif
    void *pRet = SQLITE_INT_TO_PTR(SQLITE_ERROR);
    vdbeSorterBlockDebug(pTask, !bDone, "enter");
    (void)sqlite3ThreadJoin(pTask->pThread, &pRet);
    vdbeSorterBlockDebug(pTask, !bDone, "exit");
    rc = SQLITE_PTR_TO_INT(pRet);
    assert( pTask->bDone==1 );
    pTask->bDone = 0;
    pTask->pThread = 0;
  }
  return rc;
}